

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

short map_packet_type_to_sll_type(short sll_pkttype)

{
  uint16_t local_a;
  short sll_pkttype_local;
  
  switch(sll_pkttype) {
  case 0:
    local_a = htons(0);
    break;
  case 1:
    local_a = htons(1);
    break;
  case 2:
    local_a = htons(2);
    break;
  case 3:
    local_a = htons(3);
    break;
  case 4:
    local_a = htons(4);
    break;
  default:
    local_a = 0xffff;
  }
  return local_a;
}

Assistant:

static short int
map_packet_type_to_sll_type(short int sll_pkttype)
{
	switch (sll_pkttype) {

	case PACKET_HOST:
		return htons(LINUX_SLL_HOST);

	case PACKET_BROADCAST:
		return htons(LINUX_SLL_BROADCAST);

	case PACKET_MULTICAST:
		return  htons(LINUX_SLL_MULTICAST);

	case PACKET_OTHERHOST:
		return htons(LINUX_SLL_OTHERHOST);

	case PACKET_OUTGOING:
		return htons(LINUX_SLL_OUTGOING);

	default:
		return -1;
	}
}